

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float16 float16_mul_x86_64(float16 a,float16 b,float_status *status)

{
  ulong uVar1;
  _Bool _Var2;
  float16 fVar3;
  FloatParts FVar4;
  FloatParts FVar5;
  FloatParts pr;
  FloatParts pb;
  FloatParts pa;
  float_status *status_local;
  float16 b_local;
  float16 a_local;
  uint64_t local_a8;
  uint64_t local_88;
  int local_5c;
  uint64_t uStack_58;
  int exp;
  uint64_t lo;
  uint64_t hi;
  float_status *pfStack_40;
  _Bool sign;
  uint64_t local_38;
  int local_30;
  FloatClass FStack_2c;
  _Bool _Stack_2b;
  undefined2 uStack_2a;
  uint64_t local_28;
  int local_20;
  FloatClass FStack_1c;
  _Bool _Stack_1b;
  undefined2 uStack_1a;
  FloatParts local_18;
  
  FVar4 = float16a_unpack_canonical(a,status,&float16_params);
  local_88 = FVar4.frac;
  FVar5 = float16a_unpack_canonical(b,status,&float16_params);
  local_a8 = FVar5.frac;
  local_28 = local_88;
  local_20 = FVar4.exp;
  FStack_1c = FVar4.cls;
  _Stack_1b = FVar4.sign;
  uStack_1a = FVar4._14_2_;
  local_38 = local_a8;
  local_30 = FVar5.exp;
  FStack_2c = FVar5.cls;
  _Stack_2b = FVar5.sign;
  uStack_2a = FVar5._14_2_;
  hi._7_1_ = (_Stack_1b & 1U) != (_Stack_2b & 1U);
  pfStack_40 = status;
  if ((FStack_1c == float_class_normal) && (FStack_2c == float_class_normal)) {
    local_5c = local_20 + local_30;
    mul64To128(local_88,local_a8,&lo,&stack0xffffffffffffffa8);
    shift128RightJamming(lo,uStack_58,0x3e,&lo,&stack0xffffffffffffffa8);
    if ((uStack_58 & 0x8000000000000000) != 0) {
      shift64RightJamming(uStack_58,1,&stack0xffffffffffffffa8);
      local_5c = local_5c + 1;
    }
    local_20 = local_5c;
    _Stack_1b = (_Bool)(hi._7_1_ & 1);
    local_28 = uStack_58;
    uVar1 = CONCAT26(uStack_1a,CONCAT15(hi._7_1_,CONCAT14(FStack_1c,local_5c))) & 0xffff01ffffffffff
    ;
    local_18.exp = (int)uVar1;
    local_18.cls = (char)(uVar1 >> 0x20);
    local_18.sign = (_Bool)(char)(uVar1 >> 0x28);
    local_18._14_2_ = (short)(uVar1 >> 0x30);
    local_18.frac = uStack_58;
  }
  else {
    _Var2 = is_nan(FStack_1c);
    if (!_Var2) {
      _Var2 = is_nan(FStack_2c);
      if (!_Var2) {
        if (((FStack_1c == float_class_inf) && (FStack_2c == float_class_zero)) ||
           ((FStack_1c == float_class_zero && (FStack_2c == float_class_inf)))) {
          pfStack_40->float_exception_flags = pfStack_40->float_exception_flags | 1;
          local_18 = parts_default_nan(pfStack_40);
        }
        else if ((FStack_1c == float_class_inf) || (FStack_1c == float_class_zero)) {
          _Stack_1b = (_Bool)(hi._7_1_ & 1);
          uVar1 = CONCAT26(uStack_1a,CONCAT15(hi._7_1_,CONCAT14(FStack_1c,local_20))) &
                  0xffff01ffffffffff;
          local_18.exp = (int)uVar1;
          local_18.cls = (char)(uVar1 >> 0x20);
          local_18.sign = (_Bool)(char)(uVar1 >> 0x28);
          local_18._14_2_ = (short)(uVar1 >> 0x30);
          local_18.frac = local_28;
        }
        else {
          if ((FStack_2c != float_class_inf) && (FStack_2c != float_class_zero)) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                       ,0x4e6,(char *)0x0);
          }
          _Stack_2b = (_Bool)(hi._7_1_ & 1);
          uVar1 = CONCAT26(uStack_2a,CONCAT15(hi._7_1_,CONCAT14(FStack_2c,local_30))) &
                  0xffff01ffffffffff;
          local_18.exp = (int)uVar1;
          local_18.cls = (char)(uVar1 >> 0x20);
          local_18.sign = (_Bool)(char)(uVar1 >> 0x28);
          local_18._14_2_ = (short)(uVar1 >> 0x30);
          local_18.frac = local_38;
        }
        goto LAB_004c226c;
      }
    }
    FVar5.exp = local_20;
    FVar5.frac = local_28;
    FVar5.cls = FStack_1c;
    FVar5.sign = _Stack_1b;
    FVar5._14_2_ = uStack_1a;
    FVar4.exp = local_30;
    FVar4.frac = local_38;
    FVar4.cls = FStack_2c;
    FVar4.sign = _Stack_2b;
    FVar4._14_2_ = uStack_2a;
    local_18 = pick_nan(FVar5,FVar4,pfStack_40);
  }
LAB_004c226c:
  fVar3 = float16a_round_pack_canonical(local_18,status,&float16_params);
  return fVar3;
}

Assistant:

float16 QEMU_FLATTEN float16_mul(float16 a, float16 b, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pr = mul_floats(pa, pb, status);

    return float16_round_pack_canonical(pr, status);
}